

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_dependent_join.cpp
# Opt level: O1

void duckdb::CreateDelimJoinConditions
               (LogicalComparisonJoin *delim_join,
               vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns,
               vector<duckdb::ColumnBinding,_true> *bindings,idx_t base_offset,bool perform_delim)

{
  ulong __n;
  _Alloc_hider _Var1;
  size_type sVar2;
  const_reference args_2;
  reference args_2_00;
  InternalException *this;
  size_type sVar3;
  undefined3 in_register_00000081;
  size_type __n_00;
  JoinCondition cond;
  long *local_70;
  string local_68;
  vector<duckdb::CorrelatedColumnInfo,_true> *local_48;
  vector<duckdb::JoinCondition,_true> *local_40;
  idx_t local_38;
  
  sVar3 = 1;
  if (CONCAT31(in_register_00000081,perform_delim) != 0) {
    sVar3 = ((long)(correlated_columns->
                   super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   ).
                   super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(correlated_columns->
                   super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   ).
                   super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
  }
  if (sVar3 != 0) {
    local_40 = &delim_join->conditions;
    __n_00 = 0;
    local_48 = correlated_columns;
    local_38 = base_offset;
    do {
      args_2 = vector<duckdb::CorrelatedColumnInfo,_true>::operator[](local_48,__n_00);
      __n = local_38 + __n_00;
      if ((ulong)((long)(bindings->
                        super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>)
                        .
                        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(bindings->
                        super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>)
                        .
                        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= __n) {
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Delim join - binding index out of range","");
        InternalException::InternalException(this,&local_68);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,duckdb::ColumnBinding_const&>
                ((duckdb *)&local_70,&args_2->name,&args_2->type,&args_2->binding);
      _Var1._M_p = local_68._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)local_70;
      local_70 = (long *)0x0;
      if ((long *)_Var1._M_p != (long *)0x0) {
        (**(code **)(*(long *)_Var1._M_p + 8))();
      }
      if (local_70 != (long *)0x0) {
        (**(code **)(*local_70 + 8))();
      }
      args_2_00 = vector<duckdb::ColumnBinding,_true>::operator[](bindings,__n);
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,duckdb::ColumnBinding&>
                ((duckdb *)&local_70,&args_2->name,&args_2->type,args_2_00);
      sVar2 = local_68._M_string_length;
      local_68._M_string_length = (size_type)local_70;
      local_70 = (long *)0x0;
      if ((long *)sVar2 != (long *)0x0) {
        (**(code **)(*(long *)sVar2 + 8))();
      }
      if (local_70 != (long *)0x0) {
        (**(code **)(*local_70 + 8))();
      }
      local_68.field_2._M_local_buf[0] = '(';
      ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
      emplace_back<duckdb::JoinCondition>
                (&local_40->
                  super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                 (JoinCondition *)&local_68);
      if ((long *)local_68._M_string_length != (long *)0x0) {
        (**(code **)(*(long *)local_68._M_string_length + 8))();
      }
      local_68._M_string_length = 0;
      if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
      }
      __n_00 = __n_00 + 1;
    } while (sVar3 != __n_00);
  }
  return;
}

Assistant:

static void CreateDelimJoinConditions(LogicalComparisonJoin &delim_join,
                                      const vector<CorrelatedColumnInfo> &correlated_columns,
                                      vector<ColumnBinding> bindings, idx_t base_offset, bool perform_delim) {
	auto col_count = perform_delim ? correlated_columns.size() : 1;
	for (idx_t i = 0; i < col_count; i++) {
		auto &col = correlated_columns[i];
		auto binding_idx = base_offset + i;
		if (binding_idx >= bindings.size()) {
			throw InternalException("Delim join - binding index out of range");
		}
		JoinCondition cond;
		cond.left = make_uniq<BoundColumnRefExpression>(col.name, col.type, col.binding);
		cond.right = make_uniq<BoundColumnRefExpression>(col.name, col.type, bindings[binding_idx]);
		cond.comparison = ExpressionType::COMPARE_NOT_DISTINCT_FROM;
		delim_join.conditions.push_back(std::move(cond));
	}
}